

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectArchive.cpp
# Opt level: O0

void __thiscall Diligent::DeviceObjectArchive::ArchiveHeader::ArchiveHeader(ArchiveHeader *this)

{
  ArchiveHeader *this_local;
  
  this->MagicNumber = 0xde00000a;
  this->Version = 8;
  this->APIVersion = 0x3e808;
  this->ContentVersion = 0;
  this->GitHash = (char *)0x0;
  this->GitHash = "9c77d7ae";
  return;
}

Assistant:

DeviceObjectArchive::ArchiveHeader::ArchiveHeader() noexcept
{
#ifdef DILIGENT_CORE_COMMIT_HASH
    GitHash = DILIGENT_CORE_COMMIT_HASH;
#endif
}